

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

void Intra4Preds_C(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined4 uVar7;
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined7 uVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  uint5 uVar20;
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [15];
  uint7 uVar24;
  int iVar25;
  uint uVar26;
  uint8_t *puVar27;
  uint8_t uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  byte bVar32;
  ushort uVar33;
  ushort uVar34;
  byte bVar39;
  short sVar36;
  ushort uVar37;
  ushort uVar38;
  short sVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  undefined1 auVar35 [16];
  undefined1 auVar45 [16];
  
  uVar26 = *(uint *)top;
  auVar9[0xc] = (char)(uVar26 >> 0x18);
  auVar9._0_12_ = ZEXT712(0);
  uVar20 = CONCAT32(auVar9._10_3_,(ushort)(byte)(uVar26 >> 0x10));
  auVar22._5_8_ = 0;
  auVar22._0_5_ = uVar20;
  uVar7 = *(undefined4 *)(top + -5);
  uVar8 = (ulong)(ushort)uVar7 & 0xffffffffffff00ff;
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar8;
  auVar10[0xc] = (char)((uint)uVar7 >> 0x18);
  auVar11[8] = (char)((uint)uVar7 >> 0x10);
  auVar11._0_8_ = uVar8;
  auVar11[9] = 0;
  auVar11._10_3_ = auVar10._10_3_;
  auVar21._5_8_ = 0;
  auVar21._0_5_ = auVar11._8_5_;
  auVar12[4] = (char)((uint)uVar7 >> 8);
  auVar12._0_4_ = (int)uVar8;
  auVar12[5] = 0;
  auVar12._6_7_ = SUB137(auVar21 << 0x40,6);
  iVar25 = ((uint)(uint3)(auVar10._10_3_ >> 0x10) + (uint)(uint3)(auVar9._10_3_ >> 0x10) +
            auVar12._4_4_ + (int)CONCAT72(SUB137(auVar22 << 0x40,6),(ushort)(byte)(uVar26 >> 8)) +
            auVar11._8_4_ + (int)uVar20 + (int)uVar8 + (uVar26 & 0xff) + 4 >> 3 & 0xff) * 0x1010101;
  *(int *)(dst + 0x600) = iVar25;
  *(int *)(dst + 0x620) = iVar25;
  *(int *)(dst + 0x640) = iVar25;
  *(int *)(dst + 0x660) = iVar25;
  puVar27 = dst + 0x604;
  bVar32 = top[-1];
  lVar29 = 0;
  do {
    bVar39 = top[-2 - lVar29];
    lVar31 = 0;
    do {
      puVar27[lVar31] = clip1[(ulong)top[lVar31] + (ulong)bVar39 + (0xff - (ulong)bVar32)];
      lVar31 = lVar31 + 1;
    } while (lVar31 != 4);
    puVar27 = puVar27 + 0x20;
    lVar29 = lVar29 + 1;
  } while (lVar29 != 4);
  uVar7 = *(undefined4 *)top;
  bVar39 = (byte)((uint)uVar7 >> 0x18);
  uVar17 = CONCAT25((short)(((uint7)bVar39 << 0x30) >> 0x28),
                    CONCAT14((char)((uint)uVar7 >> 0x10),uVar7));
  uVar24 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar17 >> 0x20),uVar7) >> 0x18),
                           (char)((uint)uVar7 >> 8)) & 0xffffff00ff;
  bVar32 = (byte)uVar7;
  sVar36 = (short)uVar24;
  sVar40 = (short)((uint7)uVar17 >> 0x20);
  auVar13[0xe] = bVar39;
  auVar13._0_14_ = ZEXT414(0);
  auVar15._10_2_ = sVar40;
  auVar15._0_10_ = (unkuint10)0;
  auVar15._12_3_ = auVar13._12_3_;
  auVar18._10_5_ = auVar15._10_5_;
  auVar18._0_10_ = (unkuint10)0;
  auVar23._2_7_ = auVar18._8_7_;
  auVar23._0_2_ = sVar36;
  auVar23._9_6_ = 0;
  auVar45._0_2_ = CONCAT11(0,top[-1]);
  auVar35 = ZEXT516(CONCAT14(bVar39,SUB154(auVar23 << 0x30,4))) << 0x40;
  auVar14._12_2_ = sVar40 + 2;
  auVar14._0_12_ = auVar35._0_12_;
  auVar14[0xe] = bVar39;
  auVar16._10_2_ = sVar40;
  auVar16._0_10_ = auVar35._0_10_;
  auVar16._12_3_ = auVar14._12_3_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar19._8_2_ = sVar36 + 2;
  auVar19._6_2_ = sVar36;
  auVar19._0_6_ = (uint6)bVar32 << 0x20;
  auVar45[2] = bVar32;
  auVar45[3] = 0;
  auVar45._4_11_ = auVar19._4_11_;
  auVar45[0xf] = 0;
  auVar35 = pshufhw(ZEXT716(CONCAT52((int5)uVar24,(ushort)bVar32)),auVar45,0xf8);
  uVar8 = auVar35._8_8_ & 0xffffffffffff;
  uVar33 = (ushort)((short)uVar8 + (ushort)bVar32 * 2 + auVar45._0_2_) >> 2;
  uVar37 = (ushort)((short)(uVar8 >> 0x10) + sVar36 * 2 + (ushort)bVar32) >> 2;
  uVar41 = (ushort)((short)(uVar8 >> 0x20) + sVar40 * 2 + sVar36 + 2) >> 2;
  uVar43 = (ushort)((ushort)top[4] + (ushort)bVar39 * 2 + sVar40 + 2) >> 2;
  uVar34 = uVar33 & 0xff;
  uVar38 = uVar37 & 0xff;
  uVar42 = uVar41 & 0xff;
  uVar44 = uVar43 & 0xff;
  lVar29 = 0;
  do {
    *(uint *)(dst + lVar29 + 0x608) =
         CONCAT13((uVar44 != 0) * (uVar44 < 0x100) * (char)uVar43 - (0xff < uVar44),
                  CONCAT12((uVar42 != 0) * (uVar42 < 0x100) * (char)uVar41 - (0xff < uVar42),
                           CONCAT11((uVar38 != 0) * (uVar38 < 0x100) * (char)uVar37 -
                                    (0xff < uVar38),
                                    (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar33 -
                                    (0xff < uVar34))));
    lVar29 = lVar29 + 0x20;
  } while (lVar29 != 0x80);
  bVar32 = top[-2];
  bVar39 = top[-3];
  bVar1 = top[-4];
  bVar2 = top[-5];
  *(uint *)(dst + 0x60c) = ((uint)top[-1] + (uint)bVar32 * 2 + (uint)bVar39 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x62c) = ((uint)bVar32 + (uint)bVar39 * 2 + (uint)bVar1 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x64c) = ((uint)bVar39 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x66c) = ((uint)bVar1 + (uint)bVar2 + 2 + (uint)bVar2 * 2 >> 2) * 0x1010101;
  bVar32 = top[-1];
  bVar39 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = *top;
  bVar4 = top[1];
  bVar5 = top[2];
  bVar6 = top[3];
  dst[0x670] = (uint8_t)((uint)top[-5] + (uint)bVar1 + (uint)bVar2 * 2 + 2 >> 2);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x671] = uVar28;
  dst[0x650] = uVar28;
  uVar28 = (uint8_t)((uint)bVar32 + (uint)bVar39 * 2 + 2 + (uint)bVar1 >> 2);
  dst[0x672] = uVar28;
  dst[0x651] = uVar28;
  dst[0x630] = uVar28;
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar32 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x673] = uVar28;
  dst[0x652] = uVar28;
  dst[0x631] = uVar28;
  dst[0x610] = uVar28;
  uVar28 = (uint8_t)((uint)bVar32 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x653] = uVar28;
  dst[0x632] = uVar28;
  dst[0x611] = uVar28;
  uVar28 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[0x633] = uVar28;
  dst[0x612] = uVar28;
  dst[0x613] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  bVar32 = top[-1];
  bVar39 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = *top;
  uVar30 = (uint)bVar3;
  bVar4 = top[1];
  uVar26 = (uint)bVar4;
  bVar5 = top[2];
  bVar6 = top[3];
  uVar28 = (uint8_t)((uint)bVar3 + (uint)bVar32 + 1 >> 1);
  dst[0x655] = uVar28;
  dst[0x614] = uVar28;
  uVar28 = (uint8_t)((uint)bVar3 + (uint)bVar4 + 1 >> 1);
  dst[0x656] = uVar28;
  dst[0x615] = uVar28;
  uVar28 = (uint8_t)((uint)bVar5 + (uint)bVar4 + 1 >> 1);
  dst[0x657] = uVar28;
  dst[0x616] = uVar28;
  dst[0x617] = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x674] = (uint8_t)((uint)bVar2 + (uint)bVar39 + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x654] = (uint8_t)((uint)bVar1 + (uint)bVar32 + 2 + (uint)bVar39 * 2 >> 2);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar32 * 2 + 2 + uVar30 >> 2);
  dst[0x675] = uVar28;
  dst[0x634] = uVar28;
  uVar28 = (uint8_t)((uint)bVar32 + uVar30 * 2 + 2 + uVar26 >> 2);
  dst[0x676] = uVar28;
  dst[0x635] = uVar28;
  uVar28 = (uint8_t)(uVar30 + uVar26 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x677] = uVar28;
  dst[0x636] = uVar28;
  dst[0x637] = (uint8_t)(uVar26 + (uint)bVar5 * 2 + (uint)bVar6 + 2 >> 2);
  bVar32 = top[1];
  bVar39 = top[2];
  bVar1 = top[3];
  bVar2 = top[4];
  bVar3 = top[5];
  bVar4 = top[6];
  bVar5 = top[7];
  dst[0x618] = (uint8_t)((uint)*top + (uint)bVar32 * 2 + (uint)bVar39 + 2 >> 2);
  uVar28 = (uint8_t)((uint)bVar32 + (uint)bVar39 * 2 + (uint)bVar1 + 2 >> 2);
  dst[0x638] = uVar28;
  dst[0x619] = uVar28;
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x658] = uVar28;
  dst[0x639] = uVar28;
  dst[0x61a] = uVar28;
  uVar28 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x678] = uVar28;
  dst[0x659] = uVar28;
  dst[0x63a] = uVar28;
  dst[0x61b] = uVar28;
  uVar28 = (uint8_t)((uint)bVar2 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x679] = uVar28;
  dst[0x65a] = uVar28;
  dst[0x63b] = uVar28;
  uVar28 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[0x67a] = uVar28;
  dst[0x65b] = uVar28;
  dst[0x67b] = (uint8_t)((uint)bVar4 + (uint)bVar5 + 2 + (uint)bVar5 * 2 >> 2);
  bVar32 = *top;
  bVar39 = top[1];
  bVar1 = top[2];
  bVar2 = top[3];
  bVar3 = top[4];
  bVar4 = top[5];
  bVar5 = top[6];
  bVar6 = top[7];
  dst[0x61c] = (uint8_t)((uint)bVar39 + (uint)bVar32 + 1 >> 1);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar1 + 1 >> 1);
  dst[0x65c] = uVar28;
  dst[0x61d] = uVar28;
  uVar28 = (uint8_t)((uint)bVar2 + (uint)bVar1 + 1 >> 1);
  dst[0x65d] = uVar28;
  dst[0x61e] = uVar28;
  uVar28 = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x65e] = uVar28;
  dst[0x61f] = uVar28;
  dst[0x63c] = (uint8_t)((uint)bVar32 + (uint)bVar39 * 2 + (uint)bVar1 + 2 >> 2);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar1 * 2 + (uint)bVar2 + 2 >> 2);
  dst[0x67c] = uVar28;
  dst[0x63d] = uVar28;
  uVar28 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x67d] = uVar28;
  dst[0x63e] = uVar28;
  uVar28 = (uint8_t)((uint)bVar2 + (uint)bVar3 * 2 + 2 + (uint)bVar4 >> 2);
  dst[0x67e] = uVar28;
  dst[0x63f] = uVar28;
  dst[0x65f] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x67f] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  bVar32 = top[-1];
  bVar39 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = top[-5];
  bVar4 = *top;
  bVar5 = top[1];
  bVar6 = top[2];
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar32 + 1 >> 1);
  dst[0x6a2] = uVar28;
  dst[0x680] = uVar28;
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar1 + 1 >> 1);
  dst[0x6c2] = uVar28;
  dst[0x6a0] = uVar28;
  uVar28 = (uint8_t)((uint)bVar2 + (uint)bVar1 + 1 >> 1);
  dst[0x6e2] = uVar28;
  dst[0x6c0] = uVar28;
  dst[0x6e0] = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x683] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  dst[0x682] = (uint8_t)((uint)bVar32 + (uint)bVar4 * 2 + 2 + (uint)bVar5 >> 2);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar32 * 2 + 2 + (uint)bVar4 >> 2);
  dst[0x6a3] = uVar28;
  dst[0x681] = uVar28;
  uVar28 = (uint8_t)((uint)bVar32 + (uint)bVar1 + 2 + (uint)bVar39 * 2 >> 2);
  dst[0x6c3] = uVar28;
  dst[0x6a1] = uVar28;
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar2 + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x6e3] = uVar28;
  dst[0x6c1] = uVar28;
  dst[0x6e1] = (uint8_t)((uint)bVar1 + (uint)bVar3 + (uint)bVar2 * 2 + 2 >> 2);
  bVar32 = top[-2];
  bVar39 = top[-3];
  bVar1 = top[-4];
  bVar2 = top[-5];
  dst[0x684] = (uint8_t)((uint)bVar39 + (uint)bVar32 + 1 >> 1);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar1 + 1 >> 1);
  dst[0x6a4] = uVar28;
  dst[0x686] = uVar28;
  uVar28 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 1 >> 1);
  dst[0x6c4] = uVar28;
  dst[0x6a6] = uVar28;
  dst[0x685] = (uint8_t)((uint)bVar32 + (uint)bVar39 * 2 + (uint)bVar1 + 2 >> 2);
  uVar28 = (uint8_t)((uint)bVar39 + (uint)bVar2 + (uint)bVar1 * 2 + 2 >> 2);
  dst[0x6a5] = uVar28;
  dst[0x687] = uVar28;
  uVar28 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 2 + (uint)bVar2 * 2 >> 2);
  dst[0x6c5] = uVar28;
  dst[0x6a7] = uVar28;
  auVar35 = pshuflw(ZEXT216(CONCAT11(bVar2,bVar2)),ZEXT216(CONCAT11(bVar2,bVar2)),0);
  *(int *)(dst + 0x6e4) = auVar35._0_4_;
  dst[0x6c6] = bVar2;
  dst[0x6c7] = bVar2;
  return;
}

Assistant:

static void DC4(uint8_t* dst, const uint8_t* top) {
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += top[i] + top[-5 + i];
  Fill(dst, dc >> 3, 4);
}